

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall chrono::ChFile_ps::DrawGraphAxes(ChFile_ps *this,ChFile_ps_graph_setting *msetting)

{
  char *__format;
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 local_298 [16];
  double local_288;
  double dStack_280;
  char numstr [20];
  ChVector2<double> local_218;
  ChVector2<double> local_208;
  ChVector2<double> local_1f8;
  ChVector2<double> local_1e8;
  ChVector2<double> local_1d8;
  ChVector2<double> local_1c8;
  ChVector2<double> local_1b8;
  ChVector2<double> local_1a8;
  ChVector2<double> local_198;
  ChVector2<double> local_188;
  double local_178;
  double dStack_170;
  ChVector2<double> local_168;
  ChVector2<double> local_158;
  ChVector2<double> local_148;
  ChVector2<double> local_138;
  ChVector2<double> local_128;
  ChVector2<double> local_118;
  ChVector2<double> local_108;
  ChVector2<double> local_f8;
  ChVector2<double> local_e8;
  ChVector2<double> local_d8;
  ChVector2<double> local_c8;
  ChVector2<double> local_b8;
  ChVector2<double> local_a8;
  ChVector2<double> local_98;
  ChVector2<double> local_88;
  ChVector2<double> local_70;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  
  GrSave(this);
  dVar1 = (this->G_p).m_data[0];
  dVar5 = (this->G_p).m_data[1];
  local_88.m_data[0] = dVar1;
  local_88.m_data[1] = dVar5;
  To_graph_from_page(this,&local_88);
  uVar11 = numstr._8_8_;
  uVar8 = numstr._0_8_;
  local_98.m_data[0] = dVar1 + (this->Gs_p).m_data[0];
  local_98.m_data[1] = dVar5 + (this->Gs_p).m_data[1];
  To_graph_from_page(this,&local_98);
  uVar12 = numstr._8_8_;
  uVar9 = numstr._0_8_;
  GrSave(this);
  ClipToGraph(this);
  SetFont(this,"/Helvetica",(msetting->Xaxis).numbers_fontsize);
  dVar1 = (msetting->Xaxis).ticks_step;
  __format = (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format;
  auVar17._0_8_ = (double)uVar8 / dVar1;
  auVar17._8_8_ = 0;
  auVar17 = vroundsd_avx(auVar17,auVar17,10);
  local_298._0_8_ = dVar1 * auVar17._0_8_;
  while (((double)local_298._0_8_ < (double)uVar9 &&
         (((double)uVar9 - (double)uVar8) / dVar1 <= 200.0))) {
    local_298._8_8_ = 0;
    if (msetting->gridx == true) {
      local_188.m_data[1] = (double)uVar11;
      local_188.m_data[0] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_188);
      uVar13 = numstr._8_8_;
      uVar2 = numstr._0_8_;
      local_198.m_data[1] = (double)uVar12;
      local_198.m_data[0] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_198);
      uVar14 = numstr._8_8_;
      uVar10 = numstr._0_8_;
      SetWidth(this,msetting->grid_width);
      SetRGB(this,(msetting->grid_color).r,(msetting->grid_color).g,(msetting->grid_color).b);
      local_f8.m_data[0] = (double)uVar2;
      local_f8.m_data[1] = (double)uVar13;
      local_108.m_data[0] = (double)uVar10;
      local_108.m_data[1] = (double)uVar14;
      DrawLine(this,&local_f8,&local_108,PAGE);
    }
    if ((msetting->Xaxis).ticks == true) {
      local_1a8.m_data[1] = 0.0;
      local_1a8.m_data[0] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_1a8);
      uVar13 = numstr._8_8_;
      uVar2 = numstr._0_8_;
      dVar1 = (double)numstr._8_8_ + 0.1;
      SetWidth(this,(msetting->Xaxis).ticks_width);
      SetRGB(this,(msetting->Xaxis).axis_color.r,(msetting->Xaxis).axis_color.g,
             (msetting->Xaxis).axis_color.b);
      uVar14 = numstr._8_8_;
      uVar10 = numstr._0_8_;
      numstr[8] = (char)uVar13;
      numstr[9] = SUB81(uVar13,1);
      numstr[10] = SUB81(uVar13,2);
      numstr[0xb] = SUB81(uVar13,3);
      numstr[0xc] = SUB81(uVar13,4);
      numstr[0xd] = SUB81(uVar13,5);
      numstr[0xe] = SUB81(uVar13,6);
      numstr[0xf] = SUB81(uVar13,7);
      auVar7[8] = numstr[8];
      auVar7[9] = numstr[9];
      auVar7[10] = numstr[10];
      auVar7[0xb] = numstr[0xb];
      auVar7[0xc] = numstr[0xc];
      auVar7[0xd] = numstr[0xd];
      auVar7[0xe] = numstr[0xe];
      auVar7[0xf] = numstr[0xf];
      numstr[0] = (char)uVar2;
      numstr[1] = SUB81(uVar2,1);
      numstr[2] = SUB81(uVar2,2);
      numstr[3] = SUB81(uVar2,3);
      numstr[4] = SUB81(uVar2,4);
      numstr[5] = SUB81(uVar2,5);
      numstr[6] = SUB81(uVar2,6);
      numstr[7] = SUB81(uVar2,7);
      auVar7[0] = numstr[0];
      auVar7[1] = numstr[1];
      auVar7[2] = numstr[2];
      auVar7[3] = numstr[3];
      auVar7[4] = numstr[4];
      auVar7[5] = numstr[5];
      auVar7[6] = numstr[6];
      auVar7[7] = numstr[7];
      local_1b8.m_data[0] = (double)vmovlpd_avx(auVar7);
      numstr._0_8_ = uVar10;
      numstr._8_8_ = uVar14;
      local_1b8.m_data[1] = dVar1;
      DrawLine(this,&local_118,&local_1b8,PAGE);
    }
    if ((msetting->Xaxis).numbers == true) {
      SetRGB(this,(msetting->Xaxis).numbers_color.r,(msetting->Xaxis).numbers_color.g,
             (msetting->Xaxis).numbers_color.b);
      local_1c8.m_data[1] = 0.0;
      local_1c8.m_data[0] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_1c8);
      auVar6[8] = numstr[8];
      auVar6[9] = numstr[9];
      auVar6[10] = numstr[10];
      auVar6[0xb] = numstr[0xb];
      auVar6[0xc] = numstr[0xc];
      auVar6[0xd] = numstr[0xd];
      auVar6[0xe] = numstr[0xe];
      auVar6[0xf] = numstr[0xf];
      auVar6[0] = numstr[0];
      auVar6[1] = numstr[1];
      auVar6[2] = numstr[2];
      auVar6[3] = numstr[3];
      auVar6[4] = numstr[4];
      auVar6[5] = numstr[5];
      auVar6[6] = numstr[6];
      auVar6[7] = numstr[7];
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar15 = vandpd_avx512vl(local_298,auVar3);
      auVar17 = vmovhpd_avx(auVar6,(this->G_p).m_data[1]);
      uVar2 = vcmpsd_avx512f(auVar15,ZEXT816(0x3cd203af9ee75616),1);
      sprintf(numstr,__format,(ulong)!(bool)((byte)uVar2 & 1) * local_298._0_8_);
      local_288 = auVar17._0_8_;
      dStack_280 = auVar17._8_8_;
      local_128.m_data[0] = local_288 + 0.1;
      local_128.m_data[1] = dStack_280 + 0.16;
      DrawText(this,&local_128,numstr,PAGE,LEFT);
    }
    dVar1 = (msetting->Xaxis).ticks_step;
    local_298._0_8_ = (double)local_298._0_8_ + dVar1;
  }
  SetFont(this,"/Helvetica",(msetting->Yaxis).numbers_fontsize);
  dVar1 = (msetting->Yaxis).ticks_step;
  auVar15._0_8_ = (double)uVar11 / dVar1;
  auVar15._8_8_ = 0;
  auVar17 = vroundsd_avx(auVar15,auVar15,10);
  local_298._0_8_ = dVar1 * auVar17._0_8_;
  while (((double)local_298._0_8_ < (double)uVar12 &&
         (((double)uVar12 - (double)uVar11) / dVar1 <= 200.0))) {
    local_298._8_8_ = 0;
    if (msetting->gridy == true) {
      local_1d8.m_data[0] = (double)uVar8;
      local_1d8.m_data[1] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_1d8);
      uVar13 = numstr._8_8_;
      uVar2 = numstr._0_8_;
      local_1e8.m_data[0] = (double)uVar9;
      local_1e8.m_data[1] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_1e8);
      uVar14 = numstr._8_8_;
      uVar10 = numstr._0_8_;
      SetWidth(this,msetting->grid_width);
      SetRGB(this,(msetting->grid_color).r,(msetting->grid_color).g,(msetting->grid_color).b);
      local_138.m_data[0] = (double)uVar2;
      local_138.m_data[1] = (double)uVar13;
      local_148.m_data[0] = (double)uVar10;
      local_148.m_data[1] = (double)uVar14;
      DrawLine(this,&local_138,&local_148,PAGE);
    }
    if ((msetting->Yaxis).ticks == true) {
      local_1f8.m_data[0] = 0.0;
      local_1f8.m_data[1] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_1f8);
      uVar2 = numstr._8_8_;
      dVar1 = (double)numstr._0_8_ + 0.1;
      local_178 = (double)numstr._0_8_;
      dStack_170 = (double)numstr._8_8_;
      SetWidth(this,(msetting->Yaxis).ticks_width);
      SetRGB(this,(msetting->Yaxis).axis_color.r,(msetting->Yaxis).axis_color.g,
             (msetting->Yaxis).axis_color.b);
      local_158.m_data[0] = local_178;
      local_158.m_data[1] = dStack_170;
      local_208.m_data[1] = (double)uVar2;
      local_208.m_data[0] = dVar1;
      DrawLine(this,&local_158,&local_208,PAGE);
    }
    if ((msetting->Yaxis).numbers == true) {
      SetRGB(this,(msetting->Yaxis).numbers_color.r,(msetting->Yaxis).numbers_color.g,
             (msetting->Yaxis).numbers_color.b);
      local_218.m_data[0] = 0.0;
      local_218.m_data[1] = (double)local_298._0_8_;
      To_page_from_graph(this,&local_218);
      auVar16._8_8_ = 0;
      auVar16[0] = numstr[8];
      auVar16[1] = numstr[9];
      auVar16[2] = numstr[10];
      auVar16[3] = numstr[0xb];
      auVar16[4] = numstr[0xc];
      auVar16[5] = numstr[0xd];
      auVar16[6] = numstr[0xe];
      auVar16[7] = numstr[0xf];
      auVar17 = vunpcklpd_avx(*(undefined1 (*) [16])(this->G_p).m_data,auVar16);
      auVar4._8_8_ = 0x7fffffffffffffff;
      auVar4._0_8_ = 0x7fffffffffffffff;
      auVar15 = vandpd_avx512vl(local_298,auVar4);
      uVar2 = vcmpsd_avx512f(auVar15,ZEXT816(0x3cd203af9ee75616),1);
      sprintf(numstr,__format,(ulong)!(bool)((byte)uVar2 & 1) * local_298._0_8_);
      local_288 = auVar17._0_8_;
      dStack_280 = auVar17._8_8_;
      local_168.m_data[0] = local_288 + 0.16;
      local_168.m_data[1] = dStack_280 + 0.1;
      DrawText(this,&local_168,numstr,PAGE,LEFT);
    }
    dVar1 = (msetting->Yaxis).ticks_step;
    local_298._0_8_ = (double)local_298._0_8_ + dVar1;
  }
  SetWidth(this,(msetting->Xaxis).axis_width);
  SetRGB(this,(msetting->Xaxis).axis_color.r,(msetting->Xaxis).axis_color.g,
         (msetting->Xaxis).axis_color.b);
  local_40.m_data[0] = (double)uVar8;
  local_50.m_data[0] = (double)uVar9;
  local_40.m_data[1] = 0.0;
  local_50.m_data[1] = 0.0;
  DrawLine(this,&local_40,&local_50,GRAPH);
  SetWidth(this,(msetting->Yaxis).axis_width);
  SetRGB(this,(msetting->Yaxis).axis_color.r,(msetting->Yaxis).axis_color.g,
         (msetting->Yaxis).axis_color.b);
  local_60.m_data[0] = 0.0;
  local_70.m_data[0] = 0.0;
  local_60.m_data[1] = (double)uVar11;
  local_70.m_data[1] = (double)uVar12;
  DrawLine(this,&local_60,&local_70,GRAPH);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (this->G_p).m_data[0] + (this->Gs_p).m_data[0];
  auVar17 = vmovhpd_avx(auVar20,(this->G_p).m_data[1]);
  SetRGB(this,(msetting->Xaxis).label_color.r,(msetting->Xaxis).label_color.g,
         (msetting->Xaxis).label_color.b);
  SetFont(this,*(char **)(ch_font_labels + (long)(msetting->Xaxis).label_fontname * 8),
          (msetting->Xaxis).label_fontsize);
  local_298._0_8_ = auVar17._0_8_;
  local_298._8_8_ = auVar17._8_8_;
  local_a8.m_data[0] = (double)local_298._0_8_ + -0.4;
  local_a8.m_data[1] = (double)local_298._8_8_ + 0.4;
  DrawText(this,&local_a8,(msetting->Xaxis).label,PAGE,RIGHT);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (this->G_p).m_data[1] + (this->Gs_p).m_data[1];
  auVar17 = vunpcklpd_avx(*(undefined1 (*) [16])(this->G_p).m_data,auVar18);
  SetRGB(this,(msetting->Yaxis).label_color.r,(msetting->Yaxis).label_color.g,
         (msetting->Yaxis).label_color.b);
  SetFont(this,*(char **)(ch_font_labels + (long)(msetting->Yaxis).label_fontname * 8),
          (msetting->Yaxis).label_fontsize);
  local_298._0_8_ = auVar17._0_8_;
  local_298._8_8_ = auVar17._8_8_;
  local_b8.m_data[0] = (double)local_298._0_8_ + 0.7;
  local_b8.m_data[1] = (double)local_298._8_8_ + -0.3;
  DrawText(this,&local_b8,(msetting->Yaxis).label,PAGE,LEFT);
  GrRestore(this);
  SetGray(this,0.0);
  local_c8.m_data[0] = (this->G_p).m_data[0];
  local_c8.m_data[1] = (this->G_p).m_data[1];
  local_d8.m_data[0] = (this->Gs_p).m_data[0];
  local_d8.m_data[1] = (this->Gs_p).m_data[1];
  DrawRectangle(this,&local_c8,&local_d8,PAGE,false);
  if (msetting->title[0] != '\0') {
    SetFont(this,*(char **)(ch_font_labels + (long)msetting->title_fontname * 8),
            msetting->title_fontsize);
    SetRGB(this,(msetting->title_color).r,(msetting->title_color).g,(msetting->title_color).b);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = (this->G_p).m_data[1] + (this->Gs_p).m_data[1];
    auVar15 = vunpcklpd_avx(*(undefined1 (*) [16])(this->G_p).m_data,auVar19);
    auVar17 = vmovhpd_avx(ZEXT816(0),0x3fd999999999999a);
    local_e8.m_data[0] = auVar15._0_8_ + auVar17._0_8_;
    local_e8.m_data[1] = auVar15._8_8_ + auVar17._8_8_;
    DrawText(this,&local_e8,msetting->title,PAGE,LEFT);
  }
  GrRestore(this);
  return;
}

Assistant:

void ChFile_ps::DrawGraphAxes(ChFile_ps_graph_setting* msetting) {
    ChVector2<> cpt, cp1, cp2, lole_g, upri_g, org_g, org_p;

    // save old gfx mode
    GrSave();

    // some coords
    lole_g = To_graph_from_page(G_p);
    cpt.x() = G_p.x() + Gs_p.x();
    cpt.y() = G_p.y() + Gs_p.y();
    upri_g = To_graph_from_page(cpt);
    org_g.x() = org_g.y() = 0;
    org_p = To_page_from_graph(org_g);

    // Set clip region
    GrSave();
    ClipToGraph();  // ClipRectangle(G_p,Gs_p,PS_SPACE_PAGE);

    // X AXIS ticks, grid numbers
    //

    SetFont((char*)"/Helvetica", msetting->Xaxis.numbers_fontsize);

    double stpx = ceil(lole_g.x() / msetting->Xaxis.ticks_step) * msetting->Xaxis.ticks_step;
    for (double w = stpx; w < upri_g.x(); w += msetting->Xaxis.ticks_step) {
        if ((upri_g.x() - lole_g.x()) / msetting->Xaxis.ticks_step > 200.0)
            break;
        cpt.x() = w;
        cpt.y() = 0;
        if (msetting->gridx) {
            cp1 = cpt;
            cp2 = cp1;
            cp1.y() = lole_g.y();
            cp2.y() = upri_g.y();
            cp1 = To_page_from_graph(cp1);
            cp2 = To_page_from_graph(cp2);
            SetWidth(msetting->grid_width);
            SetRGB(msetting->grid_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Xaxis.ticks) {
            cp1 = To_page_from_graph(cpt);
            cp2.x() = cp1.x();
            cp2.y() = cp1.y() + 0.10;
            SetWidth(msetting->Xaxis.ticks_width);
            SetRGB(msetting->Xaxis.axis_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Xaxis.numbers) {
            char numstr[20];
            SetRGB(msetting->Xaxis.numbers_color);
            cp1 = To_page_from_graph(cpt);
            cp1.y() = G_p.y() + 0.16;
            cp1.x() = cp1.x() + 0.1;
            double tw = w;
            if (fabs(w) < 1.e-15)
                tw = 0;
            sprintf(numstr, this->number_format, tw);
            DrawText(cp1, numstr, Space::PAGE);
        }
    }

    // Y AXIS grid, numbers, ticks
    //

    SetFont((char*)"/Helvetica", msetting->Yaxis.numbers_fontsize);

    double stpy = ceil(lole_g.y() / msetting->Yaxis.ticks_step) * msetting->Yaxis.ticks_step;
    for (double h = stpy; h < upri_g.y(); h += msetting->Yaxis.ticks_step) {
        if ((upri_g.y() - lole_g.y()) / msetting->Yaxis.ticks_step > 200.0)
            break;
        cpt.x() = 0;
        cpt.y() = h;
        if (msetting->gridy) {
            cp1 = cpt;
            cp2 = cp1;
            cp1.x() = lole_g.x();
            cp2.x() = upri_g.x();
            cp1 = To_page_from_graph(cp1);
            cp2 = To_page_from_graph(cp2);
            SetWidth(msetting->grid_width);
            SetRGB(msetting->grid_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Yaxis.ticks) {
            cp1 = To_page_from_graph(cpt);
            cp2.x() = cp1.x() + 0.10;
            cp2.y() = cp1.y();
            SetWidth(msetting->Yaxis.ticks_width);
            SetRGB(msetting->Yaxis.axis_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Yaxis.numbers) {
            char numstr[20];
            SetRGB(msetting->Yaxis.numbers_color);
            cp1 = To_page_from_graph(cpt);
            cp1.x() = G_p.x() + 0.16;
            cp1.y() = cp1.y() + 0.1;
            double th = h;
            if (fabs(th) < 1.e-15)
                th = 0;
            sprintf(numstr, this->number_format, th);
            DrawText(cp1, numstr, Space::PAGE);
        }
    }

    // draw x axis line
    SetWidth(msetting->Xaxis.axis_width);
    SetRGB(msetting->Xaxis.axis_color);
    cp1 = org_g;
    cp2 = org_g;
    cp1.x() = lole_g.x();
    cp2.x() = upri_g.x();
    DrawLine(cp1, cp2, Space::GRAPH);

    // draw y axis line
    SetWidth(msetting->Yaxis.axis_width);
    SetRGB(msetting->Yaxis.axis_color);
    cp1 = org_g;
    cp2 = org_g;
    cp1.y() = lole_g.y();
    cp2.y() = upri_g.y();
    DrawLine(cp1, cp2, Space::GRAPH);

    // draw xy labels
    //if (msetting->Xaxis.label) { // pointers to static arrays are always TRUE
    cp1.x() = G_p.x() + Gs_p.x() - 0.4;
    cp1.y() = G_p.y() + 0.4;
    SetRGB(msetting->Xaxis.label_color);
    SetFont(ch_font_labels[msetting->Xaxis.label_fontname], msetting->Xaxis.label_fontsize);
    DrawText(cp1, msetting->Xaxis.label, Space::PAGE, Justification::RIGHT);
    //}
    //if (msetting->Yaxis.label) { // pointers to static arrays are always TRUE
    cp1.x() = G_p.x() + 0.7;
    cp1.y() = G_p.y() + Gs_p.y() - 0.3;
    SetRGB(msetting->Yaxis.label_color);
    SetFont(ch_font_labels[msetting->Yaxis.label_fontname], msetting->Yaxis.label_fontsize);
    DrawText(cp1, msetting->Yaxis.label, Space::PAGE);
    //}

    // restore old gfx mode -without the clipping region
    GrRestore();

    // draw enclosing frame
    SetGray(0.0);
    DrawRectangle(G_p, Gs_p, Space::PAGE, false);

    // draw title
    //if (msetting->title) // pointers to static arrays are always TRUE
    if (*msetting->title != 0) {
        SetFont(ch_font_labels[msetting->title_fontname], msetting->title_fontsize);
        SetRGB(msetting->title_color);
        cpt.x() = G_p.x() + 0.0;
        cpt.y() = G_p.y() + Gs_p.y() + 0.4;
        DrawText(cpt, msetting->title, Space::PAGE);
    }

    // return to original gfx mode
    GrRestore();
}